

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderLoader.cpp
# Opt level: O3

void __thiscall
Assimp::BlenderImporter::ExtractScene(BlenderImporter *this,Scene *out,FileDatabase *file)

{
  pointer pcVar1;
  _Base_ptr p_Var2;
  pointer pFVar3;
  StreamReader<true,_true> *this_00;
  FileBlockHead *bl;
  const_iterator this_01;
  pointer pFVar4;
  pointer extraout_RAX;
  Logger *this_02;
  long *local_1b8;
  long local_1a8 [2];
  undefined1 local_198 [112];
  ios_base local_128 [264];
  
  pcVar1 = local_198 + 0x10;
  local_198._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"Scene","");
  this_01 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
            ::find(&(file->dna).indices._M_t,(key_type *)local_198);
  if ((pointer)local_198._0_8_ != pcVar1) {
    operator_delete((void *)local_198._0_8_,local_198._16_8_ + 1);
  }
  if ((_Rb_tree_header *)this_01._M_node == &(file->dna).indices._M_t._M_impl.super__Rb_tree_header)
  {
    local_198._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_198,"There is no `Scene` structure record","");
    LogFunctions<Assimp::BlenderImporter>::ThrowException((string *)local_198);
    if ((pointer)local_198._0_8_ != pcVar1) {
      operator_delete((void *)local_198._0_8_,local_198._16_8_ + 1);
    }
  }
  pFVar4 = (file->entries).
           super_vector<Assimp::Blender::FileBlockHead,_std::allocator<Assimp::Blender::FileBlockHead>_>
           .
           super__Vector_base<Assimp::Blender::FileBlockHead,_std::allocator<Assimp::Blender::FileBlockHead>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pFVar3 = (file->entries).
           super_vector<Assimp::Blender::FileBlockHead,_std::allocator<Assimp::Blender::FileBlockHead>_>
           .
           super__Vector_base<Assimp::Blender::FileBlockHead,_std::allocator<Assimp::Blender::FileBlockHead>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pFVar4 != pFVar3) {
    p_Var2 = this_01._M_node + 2;
    this_01._M_node =
         (_Base_ptr)
         ((file->dna).structures.
          super_vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>.
          super__Vector_base<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>
          ._M_impl.super__Vector_impl_data._M_start + *(ulong *)p_Var2);
    do {
      if (*(ulong *)p_Var2 == (ulong)pFVar4->dna_index) goto LAB_004cb083;
      pFVar4 = pFVar4 + 1;
    } while (pFVar4 != pFVar3);
  }
  local_198._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_198,"There is not a single `Scene` record to load","");
  LogFunctions<Assimp::BlenderImporter>::ThrowException((string *)local_198);
  ExtractScene();
  pFVar4 = extraout_RAX;
LAB_004cb083:
  this_00 = (file->reader).
            super___shared_ptr<Assimp::StreamReader<true,_true>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  StreamReader<true,_true>::SetPtr(this_00,this_00->buffer + pFVar4->start);
  Blender::Structure::Convert<Assimp::Blender::Scene>((Structure *)this_01._M_node,out,file);
  this_02 = DefaultLogger::get();
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
  basic_formatter<char[22]>
            ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198,
             (char (*) [22])"(Stats) Fields read: ");
  std::ostream::_M_insert<unsigned_long>((ulong)local_198);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,", pointers resolved: ",0x15);
  std::ostream::_M_insert<unsigned_long>((ulong)local_198);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,", cache hits: ",0xe);
  std::ostream::_M_insert<unsigned_long>((ulong)local_198);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,", cached objects: ",0x12)
  ;
  std::ostream::_M_insert<unsigned_long>((ulong)local_198);
  std::__cxx11::stringbuf::str();
  Logger::info(this_02,(char *)local_1b8);
  if (local_1b8 != local_1a8) {
    operator_delete(local_1b8,local_1a8[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  std::ios_base::~ios_base(local_128);
  return;
}

Assistant:

void BlenderImporter::ExtractScene(Scene& out, const FileDatabase& file)
{
    const FileBlockHead* block = NULL;
    std::map<std::string,size_t>::const_iterator it = file.dna.indices.find("Scene");
    if (it == file.dna.indices.end()) {
        ThrowException("There is no `Scene` structure record");
    }

    const Structure& ss = file.dna.structures[(*it).second];

    // we need a scene somewhere to start with.
    for(const FileBlockHead& bl :file.entries) {

        // Fix: using the DNA index is more reliable to locate scenes
        //if (bl.id == "SC") {

        if (bl.dna_index == (*it).second) {
            block = &bl;
            break;
        }
    }

    if (!block) {
        ThrowException("There is not a single `Scene` record to load");
    }

    file.reader->SetCurrentPos(block->start);
    ss.Convert(out,file);

#ifndef ASSIMP_BUILD_BLENDER_NO_STATS
    ASSIMP_LOG_INFO_F(
        "(Stats) Fields read: " ,file.stats().fields_read,
        ", pointers resolved: " ,file.stats().pointers_resolved,
        ", cache hits: "        ,file.stats().cache_hits,
        ", cached objects: "    ,file.stats().cached_objects
    );
#endif
}